

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

void xmlCompileStepPattern(xmlPatParserContextPtr ctxt)

{
  byte bVar1;
  xmlDictPtr pxVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  xmlChar *str2;
  xmlChar *pxVar6;
  byte *pbVar7;
  xmlChar *pxVar8;
  xmlPatOp op;
  ulong uVar9;
  xmlPatternPtr comp;
  long lVar10;
  long lVar11;
  xmlChar *prefix;
  
  pbVar7 = ctxt->cur;
  while( true ) {
    pbVar5 = pbVar7 + 1;
    uVar9 = (ulong)(*pbVar7 - 9);
    if (0x37 < *pbVar7 - 9) break;
    if ((0x800013UL >> (uVar9 & 0x3f) & 1) == 0) {
      if (uVar9 == 0x25) {
        ctxt->cur = pbVar5;
        comp = ctxt->comp;
        op = XML_OP_ELEM;
        goto LAB_001732dd;
      }
      if (uVar9 == 0x37) {
        if ((ctxt->comp->flags & 2) != 0) goto LAB_00173431;
        ctxt->cur = pbVar5;
        goto LAB_00173256;
      }
      break;
    }
    ctxt->cur = pbVar5;
    pbVar7 = pbVar5;
  }
  str2 = xmlPatScanNCName(ctxt);
  if (ctxt->error < 0) {
    return;
  }
  pbVar7 = ctxt->cur;
  bVar1 = *pbVar7;
  if (str2 == (xmlChar *)0x0) {
    if (bVar1 != 0x2a) {
LAB_00173431:
      ctxt->error = 1;
      return;
    }
LAB_00173417:
    ctxt->cur = pbVar7 + 1;
    comp = ctxt->comp;
    op = XML_OP_ALL;
LAB_001732dd:
    iVar4 = xmlPatternAdd(ctxt,comp,op,(xmlChar *)0x0,(xmlChar *)0x0);
    str2 = (xmlChar *)0x0;
  }
  else {
    bVar3 = false;
    if ((bVar1 < 0x21) && (bVar3 = false, (0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar7 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar7) || ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar7 + 1;
        pbVar7 = pbVar7 + 1;
      }
      bVar3 = true;
    }
    pxVar6 = ctxt->cur;
    if (*pxVar6 == '*') {
LAB_001734dc:
      ctxt->error = 1;
LAB_001734e6:
      pxVar8 = (xmlChar *)0x0;
      pxVar6 = (xmlChar *)0x0;
      goto LAB_001734e9;
    }
    if (*pxVar6 == ':') {
      ctxt->cur = pxVar6 + 1;
      bVar1 = pxVar6[1];
      if (bVar1 == 0x3a) {
        ctxt->cur = pxVar6 + 2;
        iVar4 = xmlStrEqual(str2,"child");
        if (iVar4 == 0) {
          iVar4 = xmlStrEqual(str2,"attribute");
          if (iVar4 == 0) goto LAB_001734dc;
          if (ctxt->comp->dict == (xmlDictPtr)0x0) {
            (*xmlFree)(str2);
          }
          if ((ctxt->comp->flags & 2) != 0) goto LAB_001734d9;
LAB_00173256:
          xmlCompileAttributeTest(ctxt);
          if (ctxt->error == 0) {
            return;
          }
          str2 = (xmlChar *)0x0;
          goto LAB_001734e6;
        }
        if (ctxt->comp->dict == (xmlDictPtr)0x0) {
          (*xmlFree)(str2);
        }
        str2 = xmlPatScanName(ctxt);
        pbVar7 = ctxt->cur;
        if (str2 == (xmlChar *)0x0) {
          if (*pbVar7 == 0x2a) goto LAB_00173417;
LAB_001734d9:
          str2 = (xmlChar *)0x0;
          goto LAB_001734dc;
        }
        if (*pbVar7 != 0x3a) goto LAB_0017343d;
        ctxt->cur = pbVar7 + 1;
        if ((0x20 < (ulong)pbVar7[1]) || ((0x100002600U >> ((ulong)pbVar7[1] & 0x3f) & 1) == 0)) {
          pxVar6 = xmlPatScanName(ctxt);
          if (((*str2 == 'x') && ((str2[1] == 'm' && (str2[2] == 'l')))) && (str2[3] == '\0'))
          goto LAB_0017367d;
          if (ctxt->nb_namespaces < 1) goto LAB_001735ad;
          lVar10 = 0;
          lVar11 = 0;
          do {
            iVar4 = xmlStrEqual(*(xmlChar **)((long)ctxt->namespaces + lVar10 + 8),str2);
            if (iVar4 != 0) goto LAB_001735b5;
            lVar11 = lVar11 + 1;
            lVar10 = lVar10 + 0x10;
          } while (lVar11 < ctxt->nb_namespaces);
          goto LAB_001735b0;
        }
      }
      else if ((!bVar3 && bVar1 != 0x20) &&
              ((0xd < bVar1 || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)))) {
        pxVar6 = xmlPatScanName(ctxt);
        if ((*str2 != 'x') || (((str2[1] != 'm' || (str2[2] != 'l')) || (str2[3] != '\0')))) {
          if (ctxt->nb_namespaces < 1) {
LAB_001735ad:
            lVar11 = 0;
          }
          else {
            lVar10 = 0;
            lVar11 = 0;
            do {
              iVar4 = xmlStrEqual(*(xmlChar **)((long)ctxt->namespaces + lVar10 + 8),str2);
              if (iVar4 != 0) goto LAB_001735b5;
              lVar11 = lVar11 + 1;
              lVar10 = lVar10 + 0x10;
            } while (lVar11 < ctxt->nb_namespaces);
          }
LAB_001735b0:
          iVar4 = (int)lVar11;
          pxVar8 = (xmlChar *)0x0;
          goto LAB_001735e1;
        }
LAB_0017367d:
        pxVar2 = ctxt->comp->dict;
        if (pxVar2 == (xmlDictPtr)0x0) {
          pxVar8 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
        }
        else {
          pxVar8 = xmlDictLookup(pxVar2,(xmlChar *)"http://www.w3.org/XML/1998/namespace",-1);
        }
        goto LAB_001735e7;
      }
      ctxt->error = 1;
      pxVar8 = (xmlChar *)0x0;
      goto LAB_00173489;
    }
LAB_0017343d:
    iVar4 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ELEM,str2,(xmlChar *)0x0);
  }
  pxVar8 = (xmlChar *)0x0;
  pxVar6 = (xmlChar *)0x0;
  if (iVar4 == 0) {
    return;
  }
  goto LAB_001734e9;
LAB_001735b5:
  iVar4 = (int)lVar11;
  pxVar2 = ctxt->comp->dict;
  pxVar8 = *(xmlChar **)((long)ctxt->namespaces + lVar10);
  if (pxVar2 == (xmlDictPtr)0x0) {
    pxVar8 = xmlStrdup(pxVar8);
  }
  else {
    pxVar8 = xmlDictLookup(pxVar2,pxVar8,-1);
  }
LAB_001735e1:
  if (iVar4 < ctxt->nb_namespaces) {
LAB_001735e7:
    if (ctxt->comp->dict == (xmlDictPtr)0x0) {
      (*xmlFree)(str2);
    }
    if (pxVar6 == (xmlChar *)0x0) {
      if (*ctxt->cur == '*') {
        ctxt->cur = ctxt->cur + 1;
        str2 = (xmlChar *)0x0;
        iVar4 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_NS,pxVar8,(xmlChar *)0x0);
        if (iVar4 == 0) goto LAB_00173662;
      }
      else {
        ctxt->error = 1;
        str2 = (xmlChar *)0x0;
      }
LAB_00173489:
      bVar3 = false;
      pxVar6 = (xmlChar *)0x0;
    }
    else {
      iVar4 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ELEM,pxVar6,pxVar8);
      if (iVar4 == 0) {
LAB_00173662:
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      str2 = (xmlChar *)0x0;
    }
  }
  else {
    ctxt->error = 1;
    bVar3 = false;
  }
  if (bVar3) {
    return;
  }
LAB_001734e9:
  if ((pxVar8 != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(pxVar8);
  }
  if ((pxVar6 != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(pxVar6);
  }
  if ((str2 != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(str2);
    return;
  }
  return;
}

Assistant:

static void
xmlCompileStepPattern(xmlPatParserContextPtr ctxt) {
    xmlChar *token = NULL;
    xmlChar *name = NULL;
    xmlChar *URL = NULL;
    int hasBlanks = 0;

    SKIP_BLANKS;
    if (CUR == '.') {
	/*
	* Context node.
	*/
	NEXT;
	PUSH(XML_OP_ELEM, NULL, NULL);
	return;
    }
    if (CUR == '@') {
	/*
	* Attribute test.
	*/
	if (XML_STREAM_XS_IDC_SEL(ctxt->comp)) {
	    ERROR5(NULL, NULL, NULL,
		"Unexpected attribute axis in '%s'.\n", ctxt->base);
	    ctxt->error = 1;
	    return;
	}
	NEXT;
	xmlCompileAttributeTest(ctxt);
	if (ctxt->error != 0)
	    goto error;
	return;
    }
    name = xmlPatScanNCName(ctxt);
    if (ctxt->error < 0)
        return;
    if (name == NULL) {
	if (CUR == '*') {
	    NEXT;
	    PUSH(XML_OP_ALL, NULL, NULL);
	    return;
	} else {
	    ERROR(NULL, NULL, NULL,
		    "xmlCompileStepPattern : Name expected\n");
	    ctxt->error = 1;
	    return;
	}
    }
    if (IS_BLANK_CH(CUR)) {
	hasBlanks = 1;
	SKIP_BLANKS;
    }
    if (CUR == ':') {
	NEXT;
	if (CUR != ':') {
	    xmlChar *prefix = name;
	    int i;

	    if (hasBlanks || IS_BLANK_CH(CUR)) {
		ERROR5(NULL, NULL, NULL, "Invalid QName.\n", NULL);
		ctxt->error = 1;
		goto error;
	    }
	    /*
	     * This is a namespace match
	     */
	    token = xmlPatScanName(ctxt);
	    if ((prefix[0] == 'x') &&
		(prefix[1] == 'm') &&
		(prefix[2] == 'l') &&
		(prefix[3] == 0))
	    {
		XML_PAT_COPY_NSNAME(ctxt, URL, XML_XML_NAMESPACE)
	    } else {
		for (i = 0;i < ctxt->nb_namespaces;i++) {
		    if (xmlStrEqual(ctxt->namespaces[2 * i + 1], prefix)) {
			XML_PAT_COPY_NSNAME(ctxt, URL, ctxt->namespaces[2 * i])
			break;
		    }
		}
		if (i >= ctxt->nb_namespaces) {
		    ERROR5(NULL, NULL, NULL,
			"xmlCompileStepPattern : no namespace bound to prefix %s\n",
			prefix);
		    ctxt->error = 1;
		    goto error;
		}
	    }
	    XML_PAT_FREE_STRING(ctxt, prefix);
	    name = NULL;
	    if (token == NULL) {
		if (CUR == '*') {
		    NEXT;
		    PUSH(XML_OP_NS, URL, NULL);
		} else {
		    ERROR(NULL, NULL, NULL,
			    "xmlCompileStepPattern : Name expected\n");
		    ctxt->error = 1;
		    goto error;
		}
	    } else {
		PUSH(XML_OP_ELEM, token, URL);
	    }
	} else {
	    NEXT;
	    if (xmlStrEqual(name, (const xmlChar *) "child")) {
		XML_PAT_FREE_STRING(ctxt, name);
		name = xmlPatScanName(ctxt);
		if (name == NULL) {
		    if (CUR == '*') {
			NEXT;
			PUSH(XML_OP_ALL, NULL, NULL);
			return;
		    } else {
			ERROR(NULL, NULL, NULL,
			    "xmlCompileStepPattern : QName expected\n");
			ctxt->error = 1;
			goto error;
		    }
		}
		if (CUR == ':') {
		    xmlChar *prefix = name;
		    int i;

		    NEXT;
		    if (IS_BLANK_CH(CUR)) {
			ERROR5(NULL, NULL, NULL, "Invalid QName.\n", NULL);
			ctxt->error = 1;
			goto error;
		    }
		    /*
		    * This is a namespace match
		    */
		    token = xmlPatScanName(ctxt);
		    if ((prefix[0] == 'x') &&
			(prefix[1] == 'm') &&
			(prefix[2] == 'l') &&
			(prefix[3] == 0))
		    {
			XML_PAT_COPY_NSNAME(ctxt, URL, XML_XML_NAMESPACE)
		    } else {
			for (i = 0;i < ctxt->nb_namespaces;i++) {
			    if (xmlStrEqual(ctxt->namespaces[2 * i + 1], prefix)) {
				XML_PAT_COPY_NSNAME(ctxt, URL, ctxt->namespaces[2 * i])
				break;
			    }
			}
			if (i >= ctxt->nb_namespaces) {
			    ERROR5(NULL, NULL, NULL,
				"xmlCompileStepPattern : no namespace bound "
				"to prefix %s\n", prefix);
			    ctxt->error = 1;
			    goto error;
			}
		    }
		    XML_PAT_FREE_STRING(ctxt, prefix);
		    name = NULL;
		    if (token == NULL) {
			if (CUR == '*') {
			    NEXT;
			    PUSH(XML_OP_NS, URL, NULL);
			} else {
			    ERROR(NULL, NULL, NULL,
				"xmlCompileStepPattern : Name expected\n");
			    ctxt->error = 1;
			    goto error;
			}
		    } else {
			PUSH(XML_OP_ELEM, token, URL);
		    }
		} else
		    PUSH(XML_OP_ELEM, name, NULL);
		return;
	    } else if (xmlStrEqual(name, (const xmlChar *) "attribute")) {
		XML_PAT_FREE_STRING(ctxt, name)
		name = NULL;
		if (XML_STREAM_XS_IDC_SEL(ctxt->comp)) {
		    ERROR5(NULL, NULL, NULL,
			"Unexpected attribute axis in '%s'.\n", ctxt->base);
		    ctxt->error = 1;
		    goto error;
		}
		xmlCompileAttributeTest(ctxt);
		if (ctxt->error != 0)
		    goto error;
		return;
	    } else {
		ERROR5(NULL, NULL, NULL,
		    "The 'element' or 'attribute' axis is expected.\n", NULL);
		ctxt->error = 1;
		goto error;
	    }
	}
    } else if (CUR == '*') {
        if (name != NULL) {
	    ctxt->error = 1;
	    goto error;
	}
	NEXT;
	PUSH(XML_OP_ALL, token, NULL);
    } else {
	PUSH(XML_OP_ELEM, name, NULL);
    }
    return;
error:
    if (URL != NULL)
	XML_PAT_FREE_STRING(ctxt, URL)
    if (token != NULL)
	XML_PAT_FREE_STRING(ctxt, token)
    if (name != NULL)
	XML_PAT_FREE_STRING(ctxt, name)
}